

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lookup.cpp
# Opt level: O1

bool slang::ast::Lookup::withinClassRandomize
               (ASTContext *context,NameSyntax *syntax,bitmask<slang::ast::LookupFlags> flags,
               LookupResult *result)

{
  SyntaxKind SVar1;
  RandomizeDetails *pRVar2;
  Scope *pSVar3;
  size_t sVar4;
  pointer pbVar5;
  optional<slang::SourceRange> range;
  NameComponents name_00;
  string_view name_01;
  span<const_slang::ast::(anonymous_namespace)::NamePlusLoc,_18446744073709551615UL> nameParts_00;
  int colonParts_00;
  bool bVar6;
  optional<bool> oVar7;
  NameSyntax *name_02;
  __normal_iterator<const_std::basic_string_view<char,_std::char_traits<char>_>_*,_std::span<const_std::basic_string_view<char,_std::char_traits<char>_>,_18446744073709551615UL>_>
  _Var8;
  Symbol *pSVar9;
  DeclaredType *pDVar10;
  Type *pTVar11;
  LookupResult *in_R9;
  SourceRange range_00;
  SourceRange range_01;
  SourceRange range_02;
  int colonParts;
  NameComponents name;
  SmallVector<slang::ast::(anonymous_namespace)::NamePlusLoc,_4UL> nameParts;
  int local_1fc;
  NameComponents local_1f8;
  _Storage<slang::SourceRange,_true> local_1b8;
  undefined1 local_1a8;
  undefined7 uStack_1a7;
  ASTContext local_1a0;
  SmallVectorBase<slang::ast::(anonymous_namespace)::NamePlusLoc> local_168 [3];
  
  local_1fc = 0;
  local_168[0].data_ = (pointer)local_168[0].firstElement;
  local_168[0].len = 0;
  local_168[0].cap = 4;
  name_02 = syntax;
  if ((syntax->super_ExpressionSyntax).super_SyntaxNode.kind == ScopedName) {
    name_02 = anon_unknown_39::splitScopedName((ScopedNameSyntax *)syntax,local_168,&local_1fc);
  }
  pRVar2 = context->randomizeDetails;
  pSVar3 = pRVar2->classType;
  anon_unknown_39::NameComponents::NameComponents(&local_1f8,name_02);
  SVar1 = (name_02->super_ExpressionSyntax).super_SyntaxNode.kind;
  bVar6 = false;
  if ((int)SVar1 < 0x1c5) {
    if ((1 < SVar1 - IdentifierName) && (SVar1 != ClassName)) goto LAB_008833fc;
    if (local_1f8.text._M_len != 0) {
      sVar4 = (pRVar2->nameRestrictions)._M_extent._M_extent_value;
      if (sVar4 != 0) {
        pbVar5 = (pRVar2->nameRestrictions)._M_ptr;
        _Var8 = std::ranges::__find_fn::
                operator()<__gnu_cxx::__normal_iterator<const_std::basic_string_view<char,_std::char_traits<char>_>_*,_std::span<const_std::basic_string_view<char,_std::char_traits<char>_>,_18446744073709551615UL>_>,___gnu_cxx::__normal_iterator<const_std::basic_string_view<char,_std::char_traits<char>_>_*,_std::span<const_std::basic_string_view<char,_std::char_traits<char>_>,_18446744073709551615UL>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::identity>
                          ((__find_fn *)&std::ranges::find,pbVar5,pbVar5 + sVar4,&local_1f8);
        if (_Var8._M_current ==
            (pRVar2->nameRestrictions)._M_ptr + (pRVar2->nameRestrictions)._M_extent._M_extent_value
           ) goto LAB_008833f9;
      }
      name_01._M_str = local_1f8.text._M_str;
      name_01._M_len = local_1f8.text._M_len;
      pSVar9 = Scope::find(pSVar3,name_01);
      result->found = pSVar9;
      goto LAB_008832d4;
    }
  }
  else {
    if (SVar1 == SuperHandle) {
      if (pRVar2->thisVar == (Symbol *)0x0) {
        pTVar11 = (Type *)(context->scope).ptr;
      }
      else {
        pDVar10 = Symbol::getDeclaredType(pRVar2->thisVar);
        pTVar11 = DeclaredType::getType(pDVar10);
        if (pTVar11->canonical == (Type *)0x0) {
          Type::resolveCanonical(pTVar11);
        }
        pTVar11 = pTVar11->canonical + 1;
      }
      range_01.endLoc = (SourceLocation)result;
      range_01.startLoc = local_1f8.range.endLoc;
      pSVar9 = anon_unknown_39::findSuperHandle
                         ((anon_unknown_39 *)pTVar11,(Scope *)(ulong)flags.m_bits,
                          (bitmask<slang::ast::LookupFlags>)local_1f8.range.startLoc._0_4_,range_01,
                          in_R9);
LAB_008832c9:
      result->found = pSVar9;
      local_1fc = 1;
    }
    else {
      if (SVar1 != ThisHandle) goto LAB_008833fc;
      pSVar9 = pRVar2->thisVar;
      result->found = pSVar9;
      if (pSVar9 == (Symbol *)0x0) {
        range_00.endLoc = (SourceLocation)result;
        range_00.startLoc = local_1f8.range.endLoc;
        pSVar9 = anon_unknown_39::findThisHandle
                           ((anon_unknown_39 *)(context->scope).ptr,(Scope *)(ulong)flags.m_bits,
                            (bitmask<slang::ast::LookupFlags>)local_1f8.range.startLoc._0_4_,
                            range_00,in_R9);
        result->found = pSVar9;
      }
      if (result->found != (Symbol *)0x0) {
        if (local_168[0].data_[local_168[0].len - 1].kind == SuperHandle) {
          local_1f8.paramAssignments =
               local_168[0].data_[local_168[0].len - 1].name.paramAssignments;
          local_1f8.text._M_len = local_168[0].data_[local_168[0].len - 1].name.text._M_len;
          local_1f8.text._M_str = local_168[0].data_[local_168[0].len - 1].name.text._M_str;
          local_1f8.range.startLoc = local_168[0].data_[local_168[0].len - 1].name.range.startLoc;
          local_1f8.range.endLoc = local_168[0].data_[local_168[0].len - 1].name.range.endLoc;
          local_1f8.selectors._M_ptr =
               local_168[0].data_[local_168[0].len - 1].name.selectors._M_ptr;
          local_1f8.selectors._M_extent._M_extent_value =
               local_168[0].data_[local_168[0].len - 1].name.selectors._M_extent._M_extent_value;
          local_168[0].len = local_168[0].len - 1;
          if (pRVar2->thisVar == (Symbol *)0x0) {
            pTVar11 = (Type *)(context->scope).ptr;
          }
          else {
            pDVar10 = Symbol::getDeclaredType(pRVar2->thisVar);
            pTVar11 = DeclaredType::getType(pDVar10);
            if (pTVar11->canonical == (Type *)0x0) {
              Type::resolveCanonical(pTVar11);
            }
            pTVar11 = pTVar11->canonical + 1;
          }
          range_02.endLoc = (SourceLocation)result;
          range_02.startLoc = local_1f8.range.endLoc;
          pSVar9 = anon_unknown_39::findSuperHandle
                             ((anon_unknown_39 *)pTVar11,(Scope *)(ulong)flags.m_bits,
                              (bitmask<slang::ast::LookupFlags>)local_1f8.range.startLoc._0_4_,
                              range_02,in_R9);
          goto LAB_008832c9;
        }
      }
    }
LAB_008832d4:
    colonParts_00 = local_1fc;
    if (result->found != (Symbol *)0x0) {
      local_1a0.lookupIndex = 0xffffffff;
      local_1a0.flags.m_bits = 0;
      local_1a0.instanceOrProc = (Symbol *)0x0;
      local_1a0.firstTempVar = (TempVarSymbol *)0x0;
      local_1a0.randomizeDetails = (RandomizeDetails *)0x0;
      local_1a0.assertionInstance = (AssertionInstanceDetails *)0x0;
      local_1a0.scope.ptr = pSVar3;
      if (local_1fc == 0) {
        nameParts_00._M_extent._M_extent_value = local_168[0].len;
        nameParts_00._M_ptr = local_168[0].data_;
        name_00.text._M_str = local_1f8.text._M_str;
        name_00.text._M_len = local_1f8.text._M_len;
        name_00.range.startLoc = local_1f8.range.startLoc;
        name_00.range.endLoc = local_1f8.range.endLoc;
        name_00.selectors._M_ptr = local_1f8.selectors._M_ptr;
        name_00.selectors._M_extent._M_extent_value = local_1f8.selectors._M_extent._M_extent_value;
        name_00.paramAssignments = local_1f8.paramAssignments;
        bVar6 = anon_unknown_39::lookupDownward(nameParts_00,name_00,&local_1a0,flags,result);
      }
      else {
        oVar7 = anon_unknown_39::isClassType(result->found);
        if ((((ushort)oVar7.super__Optional_base<bool,_true,_true>._M_payload.
                      super__Optional_payload_base<bool> >> 8 & 1) == 0) ||
           (((ushort)oVar7.super__Optional_base<bool,_true,_true>._M_payload.
                     super__Optional_payload_base<bool> & 1) == 0)) goto LAB_008833f9;
        bVar6 = anon_unknown_39::resolveColonNames
                          (local_168,colonParts_00,&local_1f8,flags,result,&local_1a0);
      }
      if (bVar6 != false) {
        pSVar3 = (context->scope).ptr;
        local_1b8._M_value = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)syntax);
        local_1a8 = 1;
        bVar6 = true;
        range.super__Optional_base<slang::SourceRange,_true,_true>._M_payload.
        super__Optional_payload_base<slang::SourceRange>._17_7_ = uStack_1a7;
        range.super__Optional_base<slang::SourceRange,_true,_true>._M_payload.
        super__Optional_payload_base<slang::SourceRange>._M_engaged = true;
        range.super__Optional_base<slang::SourceRange,_true,_true>._M_payload.
        super__Optional_payload_base<slang::SourceRange>._M_payload._M_value = local_1b8._M_value;
        anon_unknown_39::unwrapResult(pSVar3,range,result,true);
        goto LAB_008833fc;
      }
    }
  }
LAB_008833f9:
  bVar6 = false;
LAB_008833fc:
  if (local_168[0].data_ != (pointer)local_168[0].firstElement) {
    operator_delete(local_168[0].data_);
  }
  return bVar6;
}

Assistant:

bool Lookup::withinClassRandomize(const ASTContext& context, const NameSyntax& syntax,
                                  bitmask<LookupFlags> flags, LookupResult& result) {
    int colonParts = 0;
    SmallVector<NamePlusLoc, 4> nameParts;
    const NameSyntax* first = &syntax;
    if (syntax.kind == SyntaxKind::ScopedName)
        first = splitScopedName(syntax.as<ScopedNameSyntax>(), nameParts, colonParts);

    SLANG_ASSERT(context.randomizeDetails);
    auto& details = *context.randomizeDetails;
    auto& classScope = *details.classType;

    auto findSuperScope = [&]() -> const Scope& {
        if (details.thisVar) {
            auto dt = details.thisVar->getDeclaredType();
            SLANG_ASSERT(dt);
            return dt->getType().getCanonicalType().as<ClassType>();
        }

        return *context.scope;
    };

    NameComponents name = *first;
    switch (first->kind) {
        case SyntaxKind::IdentifierName:
        case SyntaxKind::IdentifierSelectName:
        case SyntaxKind::ClassName:
            if (name.text.empty())
                return false;

            // If the nameRestrictions list is not empty, we have to verify that the
            // first element is in the list. Otherwise, an empty list indicates that
            // the lookup is unrestricted.
            if (!details.nameRestrictions.empty()) {
                if (std::ranges::find(details.nameRestrictions, name.text) ==
                    details.nameRestrictions.end()) {
                    return false;
                }
            }

            result.found = classScope.find(name.text);
            break;
        case SyntaxKind::ThisHandle:
            result.found = details.thisVar;
            if (!result.found)
                result.found = findThisHandle(*context.scope, flags, name.range, result);

            if (result.found && nameParts.back().kind == SyntaxKind::SuperHandle) {
                // Handle "this.super.whatever" the same as if the user had just
                // written "super.whatever".
                name = nameParts.back().name;
                nameParts.pop_back();
                result.found = findSuperHandle(findSuperScope(), flags, name.range, result);
                colonParts = 1;
            }
            break;
        case SyntaxKind::SuperHandle:
            result.found = findSuperHandle(findSuperScope(), flags, name.range, result);
            colonParts = 1; // pretend we used colon access to resolve class scoped name
            break;
        default:
            // Return not found; the caller should do a normal lookup
            // to handle any of these other cases.
            return false;
    }

    if (!result.found)
        return false;

    ASTContext classContext(classScope, LookupLocation::max);
    if (colonParts) {
        // Disallow package lookups in this function.
        auto isClass = isClassType(*result.found);
        if (!isClass.has_value() || !isClass.value())
            return false;

        if (!resolveColonNames(nameParts, colonParts, name, flags, result, classContext))
            return false;
    }
    else {
        if (!lookupDownward(nameParts, name, classContext, flags, result))
            return false;
    }

    unwrapResult(*context.scope, syntax.sourceRange(), result);
    return true;
}